

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_insert_node_last(lyd_node *parent,lyd_node **first_sibling,lyd_node *node)

{
  if (first_sibling == (lyd_node **)0x0) {
    __assert_fail("first_sibling && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x2c1,
                  "void lyd_insert_node_last(struct lyd_node *, struct lyd_node **, struct lyd_node *)"
                 );
  }
  if (*first_sibling != (lyd_node *)0x0) {
    lyd_insert_after_node(first_sibling,(*first_sibling)->prev,node);
    return;
  }
  if (parent != (lyd_node *)0x0) {
    lyd_insert_only_child(parent,node);
  }
  *first_sibling = node;
  return;
}

Assistant:

static void
lyd_insert_node_last(struct lyd_node *parent, struct lyd_node **first_sibling, struct lyd_node *node)
{
    assert(first_sibling && node);

    if (*first_sibling) {
        lyd_insert_after_node(first_sibling, (*first_sibling)->prev, node);
    } else if (parent) {
        lyd_insert_only_child(parent, node);
        *first_sibling = node;
    } else {
        *first_sibling = node;
    }
}